

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  int iVar1;
  ImGuiColumnsFlags IVar2;
  ulong uVar3;
  ImGuiColumns *in_RAX;
  ImGuiColumns *pIVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ImGuiColumns *pIVar10;
  bool bVar11;
  byte bVar12;
  ImGuiColumns local_80;
  
  bVar12 = 0;
  uVar6 = (ulong)(window->ColumnsStorage).Size;
  bVar11 = 0 < (long)uVar6;
  if ((0 < (long)uVar6) && (in_RAX = (window->ColumnsStorage).Data, in_RAX->ID != id)) {
    uVar3 = 1;
    do {
      uVar8 = uVar3;
      if (uVar6 == uVar8) {
        bVar11 = uVar8 < uVar6;
        goto LAB_00197121;
      }
      pIVar10 = in_RAX + 1;
      pIVar4 = in_RAX + 1;
      in_RAX = pIVar10;
      uVar3 = uVar8 + 1;
    } while (pIVar4->ID != id);
    bVar11 = uVar8 < uVar6;
  }
LAB_00197121:
  if (!bVar11) {
    ImGuiColumns::ImGuiColumns(&local_80);
    iVar9 = (window->ColumnsStorage).Size;
    iVar1 = (window->ColumnsStorage).Capacity;
    if (iVar9 == iVar1) {
      iVar9 = iVar9 + 1;
      if (iVar1 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar1 / 2 + iVar1;
      }
      if (iVar9 < iVar5) {
        iVar9 = iVar5;
      }
      if (iVar1 < iVar9) {
        pIVar4 = (ImGuiColumns *)MemAlloc((long)iVar9 * 0x60);
        pIVar10 = (window->ColumnsStorage).Data;
        if (pIVar10 != (ImGuiColumns *)0x0) {
          memcpy(pIVar4,pIVar10,(long)(window->ColumnsStorage).Size * 0x60);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar4;
        (window->ColumnsStorage).Capacity = iVar9;
      }
    }
    pIVar10 = &local_80;
    pIVar4 = (window->ColumnsStorage).Data + (window->ColumnsStorage).Size;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      IVar2 = pIVar10->Flags;
      pIVar4->ID = pIVar10->ID;
      pIVar4->Flags = IVar2;
      pIVar10 = (ImGuiColumns *)((long)pIVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      pIVar4 = (ImGuiColumns *)((long)pIVar4 + (ulong)bVar12 * -0x10 + 8);
    }
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    if (local_80.Columns.Data != (ImGuiColumnData *)0x0) {
      MemFree(local_80.Columns.Data);
    }
    in_RAX = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
    in_RAX->ID = id;
  }
  return in_RAX;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}